

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state_listener_controller.cpp
# Opt level: O0

void __thiscall
so_5::impl::state_listener_controller_t::changed
          (state_listener_controller_t *this,agent_t *agent,state_t *state)

{
  anon_class_16_2_9c5ba015 __f;
  iterator __first;
  iterator __last;
  state_t *state_local;
  agent_t *agent_local;
  state_listener_controller_t *this_local;
  
  __first = std::
            vector<std::shared_ptr<so_5::agent_state_listener_t>,_std::allocator<std::shared_ptr<so_5::agent_state_listener_t>_>_>
            ::begin(&this->m_listeners);
  __last = std::
           vector<std::shared_ptr<so_5::agent_state_listener_t>,_std::allocator<std::shared_ptr<so_5::agent_state_listener_t>_>_>
           ::end(&this->m_listeners);
  __f.state = state;
  __f.agent = agent;
  std::
  for_each<__gnu_cxx::__normal_iterator<std::shared_ptr<so_5::agent_state_listener_t>*,std::vector<std::shared_ptr<so_5::agent_state_listener_t>,std::allocator<std::shared_ptr<so_5::agent_state_listener_t>>>>,so_5::impl::state_listener_controller_t::changed(so_5::agent_t&,so_5::state_t_const&)::__0>
            ((__normal_iterator<std::shared_ptr<so_5::agent_state_listener_t>_*,_std::vector<std::shared_ptr<so_5::agent_state_listener_t>,_std::allocator<std::shared_ptr<so_5::agent_state_listener_t>_>_>_>
              )__first._M_current,
             (__normal_iterator<std::shared_ptr<so_5::agent_state_listener_t>_*,_std::vector<std::shared_ptr<so_5::agent_state_listener_t>,_std::allocator<std::shared_ptr<so_5::agent_state_listener_t>_>_>_>
              )__last._M_current,__f);
  return;
}

Assistant:

void
state_listener_controller_t::changed(
	agent_t & agent,
	const state_t & state )
{
	std::for_each(
		m_listeners.begin(),
		m_listeners.end(),
		[&agent, &state]( agent_state_listener_ref_t & listener ) {
			listener->changed( agent, state );
		} );
}